

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O3

uint cubicSolver(double *ce,double *roots)

{
  double dVar1;
  ostream *poVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  complex<double> __r;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined1 local_98 [16];
  double local_88;
  double local_78;
  double local_68;
  undefined8 uStack_60;
  double local_50;
  undefined1 local_48 [8];
  double dStack_40;
  double local_38;
  double dStack_30;
  
  dVar5 = *ce;
  local_68 = dVar5 * 0.3333333333333333;
  uStack_60 = 0;
  dVar7 = ce[1] - local_68 * dVar5;
  dVar5 = (dVar5 * 0.07407407407407407 * dVar5 + ce[1] * -0.3333333333333333) * dVar5 + ce[2];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cubicSolver:: p=",0x10);
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tq=",3);
  poVar2 = std::ostream::_M_insert<double>(dVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (1e-75 <= ABS(dVar7)) {
    local_78 = dVar5 * 0.25;
    local_88 = dVar7 * 0.037037037037037035 * dVar7 * dVar7 + dVar5 * local_78;
    dVar6 = dVar7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cubicSolver:: discriminant=",0x1b);
    poVar2 = std::ostream::_M_insert<double>(local_88);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_88 <= 0.0) {
      dStack_30 = 0.0;
      local_98._8_8_ = 0;
      local_98._0_8_ = local_78;
      local_38 = dVar5;
      std::complex<double>::operator*=((complex<double> *)local_98,(complex<double> *)&local_38);
      local_98._0_8_ = csqrt((dVar7 * dVar7 * dVar7) / 27.0 + (double)local_98._0_8_);
      local_98._0_8_ = dVar5 * -0.5 - (double)local_98._0_8_;
      dVar5 = -(double)local_98._8_8_;
      local_48 = (undefined1  [8])0x3fd5555555555555;
      local_98._8_8_ = dVar5;
      std::pow<double>((complex<double> *)local_98,(double *)local_48);
      local_38 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      local_a8 = SUB84(dVar7,0);
      dStack_30 = dVar5;
      local_88 = (double)__divdc3(local_a8,0,
                                  (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) * 3.0,
                                  dVar5 * 3.0);
      local_b8 = local_38;
      local_48 = (undefined1  [8])0xbfe0000000000000;
      dStack_40 = 0.8660254037844386;
      local_98._8_8_ = dStack_30;
      local_98._0_8_ = local_38;
      std::complex<double>::operator*=((complex<double> *)local_98,(complex<double> *)local_48);
      uStack_b0._0_4_ = local_98._0_4_;
      uStack_b0._4_4_ = local_98._4_4_;
      local_98._8_4_ = SUB84(dStack_30 * 3.0,0);
      local_98._0_8_ = local_38 * 3.0;
      local_98._12_4_ = (int)((ulong)(dStack_30 * 3.0) >> 0x20);
      std::complex<double>::operator*=((complex<double> *)local_98,(complex<double> *)local_48);
      local_78 = (double)__divdc3(local_a8,0,local_98._0_8_,local_98._8_8_);
      local_50 = (double)__divdc3(SUB84(local_38,0),dStack_30,local_48,dStack_40);
      dVar5 = (double)__divdc3(SUB84((double)local_48 * dVar7,0),dVar7 * dStack_40,local_38 * 3.0,
                               dStack_30 * 3.0);
      *roots = (local_b8 - local_88) - local_68;
      roots[1] = (uStack_b0 - local_78) - local_68;
      roots[2] = (local_50 - dVar5) - local_68;
      return 3;
    }
    if (0.0 <= local_88) {
      if (local_88 < 0.0) {
        dVar6 = sqrt(local_88);
      }
      else {
        dVar6 = SQRT(local_88);
      }
      dVar6 = dVar5 * -0.5 + dVar6;
      dVar1 = -dVar5 - dVar6;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"cubicSolver::Error cubicSolver(",0x1f);
      poVar2 = std::ostream::_M_insert<double>(*ce);
      local_98[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,1);
      poVar2 = std::ostream::_M_insert<double>(ce[1]);
      local_98[0] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,1);
      poVar2 = std::ostream::_M_insert<double>(ce[2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
      dVar1 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    if (dVar5 <= 0.0) {
      dVar5 = pow(dVar6,0.3333333333333333);
      uVar3 = SUB84(dVar5,0);
      uVar4 = (uint)((ulong)dVar5 >> 0x20);
    }
    else {
      dVar5 = pow(-dVar1,0.3333333333333333);
      uVar4 = (uint)((ulong)dVar5 >> 0x20) ^ 0x80000000;
      uVar3 = SUB84(dVar5,0);
    }
    local_b8 = (double)CONCAT44(uVar4,uVar3);
    dVar5 = (dVar7 * -0.3333333333333333) / (double)CONCAT44(uVar4,uVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cubicSolver:: u=",0x10);
    poVar2 = std::ostream::_M_insert<double>(local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tv=",3);
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cubicSolver:: u^3=",0x12);
    poVar2 = std::ostream::_M_insert<double>(local_b8 * local_b8 * local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tv^3=",5);
    poVar2 = std::ostream::_M_insert<double>(dVar5 * dVar5 * dVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    dVar5 = dVar5 + local_b8;
  }
  else if (dVar5 <= 0.0) {
    dVar5 = pow(-dVar5,0.3333333333333333);
  }
  else {
    dVar5 = pow(dVar5,0.3333333333333333);
    dVar5 = -dVar5;
  }
  *roots = dVar5 - local_68;
  return 1;
}

Assistant:

unsigned int cubicSolver(double * ce, double *roots)
//cubic equation solver
// x^3 + ce[0] x^2 + ce[1] x + ce[2] = 0
{
    // depressed cubic, Tschirnhaus transformation, x= t - b/(3a)
    // t^3 + p t +q =0
    unsigned int ret=0;
    double shift=(1./3)*ce[0];
    double p=ce[1] -shift*ce[0];
    double q=ce[0]*( (2./27)*ce[0]*ce[0]-(1./3)*ce[1])+ce[2];
    //Cardano's method,
    //	t=u+v
    //	u^3 + v^3 + ( 3 uv + p ) (u+v) + q =0
    //	select 3uv + p =0, then,
    //	u^3 + v^3 = -q
    //	u^3 v^3 = - p^3/27
    //	so, u^3 and v^3 are roots of equation,
    //	z^2 + q z - p^3/27 = 0
    //	and u^3,v^3 are,
    //		-q/2 \pm sqrt(q^2/4 + p^3/27)
    //	discriminant= q^2/4 + p^3/27
    std::cout<<"cubicSolver:: p="<<p<<"\tq="<<q<<std::endl;
    double discriminant= (1./27)*p*p*p+(1./4)*q*q;
    if ( fabs(p)< 1.0e-75) {
        ret=1;
        *roots=(q>0)?-pow(q,(1./3)):pow(-q,(1./3));
        *roots -= shift;
        return ret;
    }
    std::cout<<"cubicSolver:: discriminant="<<discriminant<<std::endl;
    if(discriminant>0) {
        double ce2[2]= {q, -1./27*p*p*p},u3[2];
        ret=quadraticSolver(ce2,u3);
        if (! ret ) { //should not happen
            std::cerr<<"cubicSolver::Error cubicSolver("<<ce[0]<<' '<<ce[1]<<' '<<ce[2]<<")\n";
        }
        ret=1;
        double u,v;
        u= (q<=0) ? pow(u3[0], 1./3): -pow(-u3[1],1./3);
        //u=(q<=0)?pow(-0.5*q+sqrt(discriminant),1./3):-pow(0.5*q+sqrt(discriminant),1./3);
        v=(-1./3)*p/u;
        std::cout<<"cubicSolver:: u="<<u<<"\tv="<<v<<std::endl;
        std::cout<<"cubicSolver:: u^3="<<u*u*u<<"\tv^3="<<v*v*v<<std::endl;
        *roots=u+v - shift;
        return ret;
    }
    ret=3;
    std::complex<double> u(q,0),rt[3];
    u=pow(-0.5*u-sqrt(0.25*u*u+p*p*p/27),1./3);
    rt[0]=u-p/(3.*u)-shift;
    std::complex<double> w(-0.5,sqrt(3.)/2);
    rt[1]=u*w-p/(3.*u*w)-shift;
    rt[2]=u/w-p*w/(3.*u)-shift;
//	std::cout<<"Roots:\n";
//	std::cout<<rt[0]<<std::endl;
//	std::cout<<rt[1]<<std::endl;
//	std::cout<<rt[2]<<std::endl;

    roots[0]=rt[0].real();
    roots[1]=rt[1].real();
    roots[2]=rt[2].real();
    return ret;
}